

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O0

flatcc_builder_ref_t
flatcc_builder_create_buffer
          (flatcc_builder_t *B,char *identifier,uint16_t block_align,flatcc_builder_ref_t object_ref
          ,uint16_t align,flatcc_builder_buffer_flags_t flags)

{
  uint is_nested_00;
  int iVar1;
  bool bVar2;
  int with_size;
  int is_nested;
  flatcc_builder_identifier_t id_out;
  flatcc_iov_state_t iov;
  undefined1 local_40 [4];
  flatbuffers_uoffset_t buffer_base;
  flatbuffers_uoffset_t buffer_size;
  flatbuffers_uoffset_t object_offset;
  flatbuffers_uoffset_t id_size;
  flatbuffers_uoffset_t header_pad;
  flatcc_builder_ref_t buffer_ref;
  flatcc_builder_buffer_flags_t flags_local;
  uint16_t align_local;
  flatcc_builder_ref_t object_ref_local;
  uint16_t block_align_local;
  char *identifier_local;
  flatcc_builder_t *B_local;
  
  buffer_size = 0;
  with_size = 0;
  is_nested_00 = (uint)((flags & 1) != 0);
  bVar2 = (flags & 2) != 0;
  header_pad._0_2_ = flags;
  header_pad._2_2_ = align;
  buffer_ref = object_ref;
  align_local = block_align;
  _object_ref_local = (int *)identifier;
  identifier_local = (char *)B;
  iVar1 = align_buffer_end(B,(uint16_t *)((long)&header_pad + 2),block_align,is_nested_00);
  if (iVar1 == 0) {
    set_min_align((flatcc_builder_t *)identifier_local,header_pad._2_2_);
    if (_object_ref_local != (int *)0x0) {
      with_size = *_object_ref_local;
      with_size = __flatbuffers_thash_read_from_le(&with_size);
      __flatbuffers_uoffset_write_to_pe(&with_size,with_size);
    }
    buffer_size = 0;
    if (with_size != 0) {
      buffer_size = 4;
    }
    iVar1 = 0;
    if (bVar2) {
      iVar1 = 4;
    }
    object_offset =
         front_pad((flatcc_builder_t *)identifier_local,buffer_size + 4 + iVar1,header_pad._2_2_);
    _is_nested = 0;
    iov.len._0_4_ = 0;
    if ((is_nested_00 != 0) || (bVar2)) {
      _is_nested = 4;
      iov._8_8_ = local_40;
      iov.iov[0].iov_base = (void *)0x4;
      iov.len._0_4_ = 1;
    }
    _is_nested = _is_nested + 4;
    iov.iov[(long)(int)iov.len + -1].iov_len = (size_t)&buffer_base;
    iov.iov[(int)iov.len].iov_base = (void *)0x4;
    iVar1 = (int)iov.len + 1;
    if (buffer_size != 0) {
      _is_nested = buffer_size + _is_nested;
      iov.iov[(long)iVar1 + -1].iov_len = (size_t)&with_size;
      iov.iov[iVar1].iov_base = (void *)(ulong)buffer_size;
      iVar1 = (int)iov.len + 2;
    }
    iov.len._0_4_ = iVar1;
    if (object_offset != 0) {
      _is_nested = object_offset + _is_nested;
      iov.iov[(long)(int)iov.len + -1].iov_len = (size_t)"";
      iov.iov[(int)iov.len].iov_base = (void *)(ulong)object_offset;
      iov.len._0_4_ = (int)iov.len + 1;
    }
    iVar1 = 0;
    if (is_nested_00 != 0 || bVar2) {
      iVar1 = 4;
    }
    iov.iov[7].iov_len._4_4_ = (*(int *)(identifier_local + 0xf0) - (int)_is_nested) + iVar1;
    if (is_nested_00 == 0) {
      __flatbuffers_uoffset_write_to_pe
                (local_40,*(int *)(identifier_local + 0xf4) - iov.iov[7].iov_len._4_4_);
    }
    else {
      __flatbuffers_uoffset_write_to_pe
                (local_40,*(int *)(identifier_local + 0xf8) - iov.iov[7].iov_len._4_4_);
    }
    __flatbuffers_uoffset_write_to_pe(&buffer_base,buffer_ref - iov.iov[7].iov_len._4_4_);
    id_size = emit_front((flatcc_builder_t *)identifier_local,(flatcc_iov_state_t *)&is_nested);
    B_local._4_4_ = id_size;
    if (id_size == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/src/runtime/builder.c"
                    ,0x313,
                    "flatcc_builder_ref_t flatcc_builder_create_buffer(flatcc_builder_t *, const char *, uint16_t, flatcc_builder_ref_t, uint16_t, flatcc_builder_buffer_flags_t)"
                   );
    }
  }
  else {
    B_local._4_4_ = 0;
  }
  return B_local._4_4_;
}

Assistant:

flatcc_builder_ref_t flatcc_builder_create_buffer(flatcc_builder_t *B,
        const char identifier[identifier_size], uint16_t block_align,
        flatcc_builder_ref_t object_ref, uint16_t align, flatcc_builder_buffer_flags_t flags)
{
    flatcc_builder_ref_t buffer_ref;
    uoffset_t header_pad, id_size = 0;
    uoffset_t object_offset, buffer_size, buffer_base;
    iov_state_t iov;
    flatcc_builder_identifier_t id_out = 0;
    int is_nested = (flags & flatcc_builder_is_nested) != 0;
    int with_size = (flags & flatcc_builder_with_size) != 0;

    if (align_buffer_end(B, &align, block_align, is_nested)) {
        return 0;
    }
    set_min_align(B, align);
    if (identifier) {
        FLATCC_ASSERT(sizeof(flatcc_builder_identifier_t) == identifier_size);
        FLATCC_ASSERT(sizeof(flatcc_builder_identifier_t) == field_size);
        memcpy(&id_out, identifier, identifier_size);
        id_out = __flatbuffers_thash_read_from_le(&id_out);
        write_identifier(&id_out, id_out);
    }
    id_size = id_out ? identifier_size : 0;
    header_pad = front_pad(B, field_size + id_size + (uoffset_t)(with_size ? field_size : 0), align);
    init_iov();
    /* ubyte vectors size field wrapping nested buffer. */
    push_iov_cond(&buffer_size, field_size, is_nested || with_size);
    push_iov(&object_offset, field_size);
    /* Identifiers are not always present in buffer. */
    push_iov(&id_out, id_size);
    push_iov(_pad, header_pad);
    buffer_base = (uoffset_t)B->emit_start - (uoffset_t)iov.len + (uoffset_t)((is_nested || with_size) ? field_size : 0);
    if (is_nested) {
        write_uoffset(&buffer_size, (uoffset_t)B->buffer_mark - buffer_base);
    } else {
        /* Also include clustered vtables. */
        write_uoffset(&buffer_size, (uoffset_t)B->emit_end - buffer_base);
    }
    write_uoffset(&object_offset, (uoffset_t)object_ref - buffer_base);
    if (0 == (buffer_ref = emit_front(B, &iov))) {
        check(0, "emitter rejected buffer content");
        return 0;
    }
    return buffer_ref;
}